

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O3

double duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileProgress
                 (ClientContext *context,FunctionData *bind_data_p,
                 GlobalTableFunctionState *global_state)

{
  __int_type _Var1;
  long lVar2;
  const_reference this;
  type this_00;
  ParquetReader *pPVar3;
  idx_t iVar4;
  ulong __n;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  shared_ptr<duckdb::BaseFileReader,_true> reader;
  unique_lock<std::mutex> parallel_lock;
  double local_78;
  shared_ptr<duckdb::BaseFileReader,_true> local_68;
  unique_lock<std::mutex> local_58;
  double local_48;
  double dStack_40;
  
  lVar2 = (**(code **)(**(long **)(global_state + 8) + 0x30))();
  if (lVar2 == 0) {
    local_78 = 100.0;
  }
  else {
    local_58._M_device = (mutex_type *)(global_state + 0x28);
    local_58._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_58);
    local_58._M_owns = true;
    __n = *(ulong *)(global_state + 0x60);
    auVar6._8_4_ = (int)(__n >> 0x20);
    auVar6._0_8_ = __n;
    auVar6._12_4_ = 0x45300000;
    local_78 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)__n) - 4503599627370496.0)) * 100.0;
    if (__n <= *(ulong *)(global_state + 0x58)) {
      do {
        if ((ulong)(*(long *)(global_state + 0x70) - *(long *)(global_state + 0x68) >> 3) <= __n)
        break;
        this = vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>,_true>
                             *)(global_state + 0x68),__n);
        if ((this->
            super_unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MultiFileReaderData_*,_std::default_delete<duckdb::MultiFileReaderData>_>
            .super__Head_base<0UL,_duckdb::MultiFileReaderData_*,_false>._M_head_impl !=
            (MultiFileReaderData *)0x0) {
          this_00 = unique_ptr<duckdb::MultiFileReaderData,_std::default_delete<duckdb::MultiFileReaderData>,_true>
                    ::operator*(this);
          if (this_00->file_state == CLOSED) {
            weak_ptr<duckdb::BaseFileReader,_true>::lock
                      ((weak_ptr<duckdb::BaseFileReader,_true> *)&local_68);
            dVar12 = 100.0;
            dVar13 = 0.0;
            if (local_68.internal.
                super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              pPVar3 = (ParquetReader *)
                       shared_ptr<duckdb::BaseFileReader,_true>::operator*(&local_68);
              _Var1 = (pPVar3->rows_read).super___atomic_base<unsigned_long>._M_i;
              iVar4 = ParquetReader::NumRows(pPVar3);
              auVar9._8_4_ = (int)(_Var1 >> 0x20);
              auVar9._0_8_ = _Var1;
              auVar9._12_4_ = 0x45300000;
              dVar13 = auVar9._8_8_ - 1.9342813113834067e+25;
              auVar10._8_4_ = (int)(iVar4 >> 0x20);
              auVar10._0_8_ = iVar4;
              auVar10._12_4_ = 0x45300000;
              dVar12 = ((dVar13 + ((double)CONCAT44(0x43300000,(int)_Var1) - 4503599627370496.0)) /
                       ((auVar10._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)iVar4) - 4503599627370496.0))) * 100.0;
            }
            if (local_68.internal.
                super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              local_48 = dVar12;
              dStack_40 = dVar13;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_68.internal.
                         super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              dVar12 = local_48;
            }
          }
          else {
            dVar12 = 0.0;
            if (this_00->file_state == OPEN) {
              pPVar3 = (ParquetReader *)
                       shared_ptr<duckdb::BaseFileReader,_true>::operator*(&this_00->reader);
              _Var1 = (pPVar3->rows_read).super___atomic_base<unsigned_long>._M_i;
              iVar4 = ParquetReader::NumRows(pPVar3);
              auVar7._8_4_ = (int)(_Var1 >> 0x20);
              auVar7._0_8_ = _Var1;
              auVar7._12_4_ = 0x45300000;
              auVar8._8_4_ = (int)(iVar4 >> 0x20);
              auVar8._0_8_ = iVar4;
              auVar8._12_4_ = 0x45300000;
              dVar12 = (((auVar7._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)_Var1) - 4503599627370496.0)) /
                       ((auVar8._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)iVar4) - 4503599627370496.0))) * 100.0;
            }
          }
          dVar13 = 100.0;
          if (dVar12 <= 100.0) {
            dVar13 = dVar12;
          }
          dVar12 = 0.0;
          if (0.0 <= dVar13) {
            dVar12 = dVar13;
          }
          local_78 = local_78 + dVar12;
          if ((__n == *(ulong *)(global_state + 0x60)) && (100.0 <= dVar12)) {
            *(ulong *)(global_state + 0x60) = __n + 1;
          }
        }
        bVar5 = __n < *(ulong *)(global_state + 0x58);
        __n = __n + 1;
      } while (bVar5);
    }
    auVar11._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar11._0_8_ = lVar2;
    auVar11._12_4_ = 0x45300000;
    local_78 = local_78 /
               ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
    std::unique_lock<std::mutex>::~unique_lock(&local_58);
  }
  return local_78;
}

Assistant:

static double MultiFileProgress(ClientContext &context, const FunctionData *bind_data_p,
	                                const GlobalTableFunctionState *global_state) {
		auto &gstate = global_state->Cast<MultiFileGlobalState>();

		auto total_count = gstate.file_list.GetTotalFileCount();
		if (total_count == 0) {
			return 100.0;
		}
		unique_lock<mutex> parallel_lock(gstate.lock);
		double total_progress = 100.0 * static_cast<double>(gstate.completed_file_index);
		// iterate over the files we haven't completed yet
		for (idx_t i = gstate.completed_file_index; i <= gstate.file_index && i < gstate.readers.size(); i++) {
			auto &reader_data_ptr = gstate.readers[i];
			if (!reader_data_ptr) {
				continue;
			}
			auto &reader_data = *reader_data_ptr;
			double progress_in_file;
			if (reader_data.file_state == MultiFileFileState::OPEN) {
				// file is currently open - get the progress within the file
				progress_in_file = OP::GetProgressInFile(context, *reader_data.reader);
			} else if (reader_data.file_state == MultiFileFileState::CLOSED) {
				// file has been closed - check if the reader is still in use
				auto reader = reader_data.closed_reader.lock();
				if (!reader) {
					// reader has been destroyed - we are done with this file
					progress_in_file = 100.0;
				} else {
					// file is still being read
					progress_in_file = OP::GetProgressInFile(context, *reader);
				}
			} else {
				// file has not been opened yet - progress in this file is zero
				progress_in_file = 0;
			}
			progress_in_file = MaxValue<double>(0.0, MinValue<double>(100.0, progress_in_file));
			total_progress += progress_in_file;
			if (i == gstate.completed_file_index && progress_in_file >= 100) {
				// if the progress in this file is 100, we have completed the file
				// we don't need to check anymore in the next iteration
				gstate.completed_file_index++;
			}
		}
		return total_progress / static_cast<double>(total_count);
	}